

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceSymbols.cpp
# Opt level: O2

bool __thiscall
slang::ast::CheckerMemberVisitor::isFromChecker(CheckerMemberVisitor *this,Symbol *symbol)

{
  Scope *pSVar1;
  Scope *pSVar2;
  
  pSVar2 = &this->body->super_Scope;
  if (this->body == (CheckerInstanceBodySymbol *)0x0) {
    pSVar2 = (Scope *)0x0;
  }
  while( true ) {
    pSVar1 = symbol->parentScope;
    if (pSVar1 == (Scope *)0x0) {
      return false;
    }
    if (pSVar1 == pSVar2) break;
    symbol = pSVar1->thisSym;
    if (symbol->kind == InstanceBody) {
      return false;
    }
  }
  return true;
}

Assistant:

bool isFromChecker(const Symbol& symbol) const {
        auto scope = symbol.getParentScope();
        while (scope) {
            if (scope == &body)
                return true;

            auto& sym = scope->asSymbol();
            if (sym.kind == SymbolKind::InstanceBody)
                break;

            scope = sym.getParentScope();
        }
        return false;
    }